

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void Assimp::WriteFormatInfo(JSONWriter *out)

{
  JSONWriter *pJVar1;
  int local_70;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  JSONWriter *local_10;
  JSONWriter *out_local;
  
  local_10 = out;
  JSONWriter::StartObj(out,false);
  pJVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"format",&local_31);
  JSONWriter::Key(pJVar1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  JSONWriter::SimpleValue<char[14]>(local_10,(char (*) [14])"\"assimp2json\"");
  pJVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"version",&local_69);
  JSONWriter::Key(pJVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_70 = 100;
  JSONWriter::SimpleValue<int>(local_10,&local_70);
  JSONWriter::EndObj(local_10);
  return;
}

Assistant:

void WriteFormatInfo(JSONWriter& out) {
    out.StartObj();
    out.Key("format");
    out.SimpleValue("\"assimp2json\"");
    out.Key("version");
    out.SimpleValue(CURRENT_FORMAT_VERSION);
    out.EndObj();
}